

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void apply_imputation_results<PredictionData<float,int>,ImputedData<int,double>>
               (PredictionData<float,_int> *prediction_data,ImputedData<int,_double> *imp,
               Imputer *imputer,size_t row)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  pointer puVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  float *pfVar9;
  unsigned_long uVar10;
  pointer piVar11;
  pointer pvVar12;
  pointer pvVar13;
  int *piVar14;
  double *pdVar15;
  double *pdVar16;
  size_t sVar17;
  long lVar18;
  int iVar19;
  size_t sVar20;
  long lVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double dVar25;
  
  bVar2 = prediction_data->is_col_major;
  sVar4 = imp->n_missing_num;
  if (bVar2 == false) {
    if (sVar4 != 0) {
      puVar5 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar17 = imputer->ncols_numeric;
      pfVar9 = prediction_data->numeric_data;
      pdVar8 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar20 = 0;
      do {
        uVar10 = puVar5[sVar20];
        dVar1 = pdVar7[sVar20];
        if (((dVar1 <= 0.0) || (dVar25 = pdVar6[sVar20], 0x7fefffffffffffff < (ulong)ABS(dVar25)))
           || ((dVar25 == 0.0 && ((!NAN(dVar25) && (NAN(pdVar8[uVar10]))))))) {
          dVar25 = pdVar8[uVar10];
        }
        else {
          dVar25 = dVar25 / dVar1;
        }
        pfVar9[sVar17 * row + uVar10] = (float)dVar25;
        sVar20 = sVar20 + 1;
      } while (sVar4 != sVar20);
    }
  }
  else if (sVar4 != 0) {
    puVar5 = (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar6 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar9 = prediction_data->numeric_data;
    sVar17 = prediction_data->nrows;
    sVar20 = 0;
    do {
      uVar10 = puVar5[sVar20];
      dVar1 = pdVar7[sVar20];
      if (((dVar1 <= 0.0) || (dVar25 = pdVar6[sVar20], 0x7fefffffffffffff < (ulong)ABS(dVar25))) ||
         ((dVar25 == 0.0 && ((!NAN(dVar25) && (NAN(pdVar8[uVar10]))))))) {
        dVar25 = pdVar8[uVar10];
      }
      else {
        dVar25 = dVar25 / dVar1;
      }
      pfVar9[row + uVar10 * sVar17] = (float)dVar25;
      sVar20 = sVar20 + 1;
    } while (sVar4 != sVar20);
  }
  pfVar9 = prediction_data->Xr;
  if (pfVar9 != (float *)0x0) {
    iVar19 = prediction_data->Xr_indptr[row];
    lVar18 = (long)iVar19;
    iVar3 = prediction_data->Xr_indptr[row + 1];
    if (iVar19 < iVar3) {
      pdVar6 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar11 = (imp->missing_sp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar8 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar21 = 0;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar9[lVar18])) {
          dVar1 = pdVar7[lVar21];
          if ((dVar1 <= 0.0) || (dVar25 = pdVar6[lVar21], 0x7fefffffffffffff < (ulong)ABS(dVar25)))
          {
            dVar25 = pdVar8[piVar11[lVar21]];
          }
          else {
            dVar25 = dVar25 / dVar1;
          }
          pfVar9[lVar18] = (float)dVar25;
          lVar21 = lVar21 + 1;
        }
        lVar18 = lVar18 + 1;
      } while (iVar3 != lVar18);
    }
  }
  sVar4 = imp->n_missing_cat;
  if (bVar2 == false) {
    if (sVar4 != 0) {
      puVar5 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar18 = row * imputer->ncols_categ;
      pvVar12 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      piVar14 = prediction_data->categ_data;
      pvVar13 = (imp->cat_sum).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      piVar11 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar17 = 0;
      do {
        uVar10 = puVar5[sVar17];
        pdVar15 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar16 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar24 = pdVar15 + 1;
        pdVar22 = pdVar15;
        pdVar23 = pdVar15;
        if (pdVar24 != pdVar16 && pdVar15 != pdVar16) {
          do {
            pdVar23 = pdVar24;
            if (*pdVar24 < *pdVar22 || *pdVar24 == *pdVar22) {
              pdVar23 = pdVar22;
            }
            pdVar24 = pdVar24 + 1;
            pdVar22 = pdVar23;
          } while (pdVar24 != pdVar16);
        }
        iVar19 = (int)((ulong)((long)pdVar23 - (long)pdVar15) >> 3);
        piVar14[lVar18 + uVar10] = iVar19;
        if (iVar19 == 0) {
          iVar19 = -1;
          if ((pdVar15 != pdVar16) && (pvVar12 != pvVar13)) {
            if (0.0 < *pdVar15) goto LAB_002a1814;
            iVar19 = piVar11[uVar10];
          }
          piVar14[lVar18 + uVar10] = iVar19;
        }
LAB_002a1814:
        sVar17 = sVar17 + 1;
      } while (sVar17 != sVar4);
    }
  }
  else if (sVar4 != 0) {
    puVar5 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar13 = (imp->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    piVar14 = prediction_data->categ_data;
    sVar17 = prediction_data->nrows;
    piVar11 = (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar20 = 0;
    do {
      uVar10 = puVar5[sVar20];
      pdVar15 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar16 = pvVar12[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pdVar24 = pdVar15 + 1;
      pdVar22 = pdVar15;
      pdVar23 = pdVar15;
      if (pdVar24 != pdVar16 && pdVar15 != pdVar16) {
        do {
          pdVar22 = pdVar24;
          if (*pdVar24 < *pdVar23 || *pdVar24 == *pdVar23) {
            pdVar22 = pdVar23;
          }
          pdVar24 = pdVar24 + 1;
          pdVar23 = pdVar22;
        } while (pdVar24 != pdVar16);
      }
      lVar18 = sVar17 * uVar10;
      iVar19 = (int)((ulong)((long)pdVar22 - (long)pdVar15) >> 3);
      piVar14[row + lVar18] = iVar19;
      if (iVar19 == 0) {
        iVar19 = -1;
        if ((pdVar15 != pdVar16) && (pvVar12 != pvVar13)) {
          if (0.0 < *pdVar15) goto LAB_002a1754;
          iVar19 = piVar11[uVar10];
        }
        piVar14[row + lVar18] = iVar19;
      }
LAB_002a1754:
      sVar20 = sVar20 + 1;
    } while (sVar20 != sVar4);
  }
  return;
}

Assistant:

void apply_imputation_results(PredictionData  &prediction_data,
                              ImputedData     &imp,
                              Imputer         &imputer,
                              size_t          row)
{
    size_t col;
    size_t pos = 0;
    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[row + col * prediction_data.nrows]
                    =
                imputer.col_means[col];
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_num; ix++)
        {
            col = imp.missing_num[ix];
            if (imp.num_weight[ix] > 0 && !is_na_or_inf(imp.num_sum[ix]) && !(imp.num_sum[ix] == 0 && std::isnan(imputer.col_means[col])))
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imp.num_sum[ix] / imp.num_weight[ix];
            else
                prediction_data.numeric_data[col + row * imputer.ncols_numeric]
                    =
                imputer.col_means[col];
        }
    }

    if (prediction_data.Xr != NULL)
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
        {
            if (is_na_or_inf(prediction_data.Xr[ix]))
            {
                if (imp.sp_num_weight[pos] > 0 && !is_na_or_inf(imp.sp_num_sum[pos]))
                    prediction_data.Xr[ix]
                        =
                    imp.sp_num_sum[pos] / imp.sp_num_weight[pos];
                else
                    prediction_data.Xr[ix]
                        =
                    imputer.col_means[imp.missing_sp[pos]];
                pos++;
            }
        }

    if (prediction_data.is_col_major)
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[row + col * prediction_data.nrows] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows] = -1;
                }

                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[row + col * prediction_data.nrows]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }

    else
    {
        for (size_t ix = 0; ix < imp.n_missing_cat; ix++)
        {
            col = imp.missing_cat[ix];
            prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
            std::distance(imp.cat_sum[col].begin(),
                          std::max_element(imp.cat_sum[col].begin(), imp.cat_sum[col].end()));

            if (prediction_data.categ_data[col + row * imputer.ncols_categ] == 0)
            {
                if (imp.cat_sum.empty() || imp.cat_sum[col].empty())
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ] = -1;
                }
                
                else if (imp.cat_sum[col][0] <= 0)
                {
                    prediction_data.categ_data[col + row * imputer.ncols_categ]
                        =
                    imputer.col_modes[col];
                }
            }
        }
    }
}